

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O2

void re2::MultithreadedBuildEntireDFA(void)

{
  Regexp *pRVar1;
  Prog *pPVar2;
  BuildThread *pBVar3;
  int i;
  int iVar4;
  int iVar5;
  int j;
  long lVar6;
  BuildThread *t;
  string s;
  vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> threads;
  
  std::__cxx11::string::string((string *)&s,"a",(allocator *)&threads);
  for (iVar4 = 0; iVar4 < FLAGS_size; iVar4 = iVar4 + 1) {
    std::__cxx11::string::append((char *)&s);
  }
  std::__cxx11::string::append((char *)&s);
  threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)s._M_dataplus._M_p;
  threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(threads.
                         super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (undefined4)s._M_string_length);
  pRVar1 = Regexp::Parse((StringPiece *)&threads,LikePerl,(RegexpStatus *)0x0);
  if (pRVar1 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&threads,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x30);
    std::operator<<((ostream *)
                    &threads.
                     super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
  }
  pPVar2 = Regexp::CompileToProg(pRVar1,0);
  if (pPVar2 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&threads,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x32);
    std::operator<<((ostream *)
                    &threads.
                     super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
  }
  pBVar3 = (BuildThread *)operator_new(0x20);
  BuildThread::BuildThread(pBVar3,pPVar2);
  Thread::SetJoinable((Thread *)pBVar3,true);
  Thread::Start((Thread *)pBVar3);
  Thread::Join((Thread *)pBVar3);
  (*(pBVar3->super_Thread)._vptr_Thread[1])(pBVar3);
  if (pPVar2 != (Prog *)0x0) {
    Prog::~Prog(pPVar2);
  }
  operator_delete(pPVar2);
  Regexp::Decref(pRVar1);
  for (iVar4 = 0; iVar4 < FLAGS_repeat; iVar4 = iVar4 + 1) {
    threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)s._M_dataplus._M_p;
    threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(threads.
                           super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           (undefined4)s._M_string_length);
    pRVar1 = Regexp::Parse((StringPiece *)&threads,LikePerl,(RegexpStatus *)0x0);
    if (pRVar1 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&threads,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x3f);
      std::operator<<((ostream *)
                      &threads.
                       super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
    }
    pPVar2 = Regexp::CompileToProg(pRVar1,0);
    if (pPVar2 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&threads,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x41);
      std::operator<<((ostream *)
                      &threads.
                       super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
    }
    threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar5 = 0; iVar5 < FLAGS_threads; iVar5 = iVar5 + 1) {
      pBVar3 = (BuildThread *)operator_new(0x20);
      BuildThread::BuildThread(pBVar3,pPVar2);
      t = pBVar3;
      Thread::SetJoinable((Thread *)pBVar3,true);
      std::vector<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::push_back(&threads,&t);
    }
    for (lVar6 = 0; lVar6 < FLAGS_threads; lVar6 = lVar6 + 1) {
      Thread::Start(&threads.
                     super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar6]->super_Thread);
    }
    for (lVar6 = 0; lVar6 < FLAGS_threads; lVar6 = lVar6 + 1) {
      Thread::Join(&threads.
                    super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar6]->super_Thread);
      if (threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar6] != (BuildThread *)0x0) {
        (*(threads.super__Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar6]->super_Thread)._vptr_Thread[1])();
      }
    }
    Prog::BuildEntireDFA(pPVar2,kFirstMatch);
    Prog::~Prog(pPVar2);
    operator_delete(pPVar2);
    Regexp::Decref(pRVar1);
    std::_Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_>::~_Vector_base
              ((_Vector_base<re2::BuildThread_*,_std::allocator<re2::BuildThread_*>_> *)&threads);
  }
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(Multithreaded, BuildEntireDFA) {
  // Create regexp with 2^FLAGS_size states in DFA.
  string s = "a";
  for (int i = 0; i < FLAGS_size; i++)
    s += "[ab]";
  s += "b";

  // Check that single-threaded code works.
  {
    //LOG(INFO) << s;
    Regexp* re = Regexp::Parse(s, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    BuildThread* t = new BuildThread(prog);
    t->SetJoinable(true);
    t->Start();
    t->Join();
    delete t;
    delete prog;
    re->Decref();
  }

  // Build the DFA simultaneously in a bunch of threads.
  for (int i = 0; i < FLAGS_repeat; i++) {
    Regexp* re = Regexp::Parse(s, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);

    vector<BuildThread*> threads;
    for (int j = 0; j < FLAGS_threads; j++) {
      BuildThread *t = new BuildThread(prog);
      t->SetJoinable(true);
      threads.push_back(t);
    }
    for (int j = 0; j < FLAGS_threads; j++)
      threads[j]->Start();
    for (int j = 0; j < FLAGS_threads; j++) {
      threads[j]->Join();
      delete threads[j];
    }

    // One more compile, to make sure everything is okay.
    prog->BuildEntireDFA(Prog::kFirstMatch);
    delete prog;
    re->Decref();
  }
}